

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

void __thiscall
vkt::rasterization::anon_unknown_0::BaseRenderingTestInstance::drawPrimitives
          (BaseRenderingTestInstance *this,Surface *result,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *positionData,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colorData,
          VkPrimitiveTopology primitiveTopology)

{
  Move<vk::Handle<(vk::HandleType)6>_> *pMVar1;
  Allocation *pAVar2;
  long *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  VkShaderModule VVar7;
  VkVertexInputBindingDescription *pVVar8;
  Handle<(vk::HandleType)18> obj;
  Surface *pSVar9;
  int iVar10;
  VkResult VVar11;
  DeviceInterface *vk;
  VkDevice pVVar12;
  VkPhysicalDeviceProperties *pVVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar14;
  ostream *poVar15;
  NotSupportedError *this_00;
  void *pvVar16;
  size_t __n;
  VkStructureType extraout_XMM0_Da;
  VkCommandBuffer local_408;
  long *plStack_400;
  undefined8 local_3f8;
  VkPipelineShaderStageCreateInfo *pVStack_3f0;
  long *local_3e8;
  deUint32 queueFamilyIndex;
  VkBuffer local_3d8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_3d0;
  VkPipelineShaderStageCreateInfo shaderStageParams [2];
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_350;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_338;
  VkDevice local_330;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  Move<vk::Handle<(vk::HandleType)18>_> local_2f8;
  VkQueue local_2d8;
  Surface *local_2d0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_2c8;
  Allocator *local_2c0;
  VkPipelineMultisampleStateCreateInfo multisampleStateParams;
  stringstream message;
  undefined4 uStack_264;
  ulong local_258;
  VkPipelineShaderStageCreateInfo *pVStack_250;
  VkPipelineVertexInputStateCreateInfo *local_248;
  undefined8 uStack_240;
  VkPipelineTessellationStateCreateInfo *local_238;
  VkPipelineShaderStageCreateInfo *pVStack_230;
  VkPipelineRasterizationStateCreateInfo *local_228;
  VkPipelineMultisampleStateCreateInfo *local_220;
  VkPipelineDepthStencilStateCreateInfo *local_218;
  VkPipelineColorBlendStateCreateInfo *local_210;
  VkPipelineDynamicStateCreateInfo *local_208;
  VkPipelineLayout local_200;
  VkRenderPass local_1f8;
  deUint32 local_1f0;
  VkPipeline local_1e8;
  deInt32 local_1e0;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkDeviceSize vertexBufferOffset;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 *local_b8;
  undefined4 local_b0;
  VkRect2D *local_a8;
  VkRect2D scissor;
  undefined8 local_90;
  float local_88;
  float local_84;
  undefined8 local_80;
  VkVertexInputAttributeDescription local_78;
  undefined8 local_68;
  undefined4 local_60;
  undefined4 local_5c;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams;
  
  local_2d0 = result;
  local_2c8 = colorData;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  local_2d8 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_2c0 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  __n = (long)(positionData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(positionData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
  local_3f8 = 0;
  pVStack_3f0 = (VkPipelineShaderStageCreateInfo *)0x0;
  local_408 = (VkCommandBuffer)0x0;
  plStack_400 = (long *)0x0;
  DStack_350.m_device = (VkDevice)0x0;
  DStack_350.m_allocator = (VkAllocationCallbacks *)0x0;
  DStack_350.m_deviceIface = (DeviceInterface *)0x0;
  DStack_3d0.m_device = (VkDevice)0x0;
  DStack_3d0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_3d8.m_internal = 0;
  DStack_3d0.m_deviceIface = (DeviceInterface *)0x0;
  local_3e8 = (long *)0x0;
  local_338 = positionData;
  pVVar13 = Context::getDeviceProperties((this->super_TestInstance).m_context);
  local_330 = pVVar12;
  if ((pVVar13->limits).maxVertexInputAttributeOffset < __n) {
    std::__cxx11::stringstream::stringstream((stringstream *)&message);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_258,"Larger vertex input attribute offset is needed (",0x30);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&local_258);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,") than the available maximum (",0x1e);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,").",2);
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    tcu::NotSupportedError::NotSupportedError
              (this_00,(char *)shaderStageParams[0]._0_8_,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0x274);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pVStack_250 = shaderStageParams;
  shaderStageParams[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStageParams[0].pNext = (void *)0x0;
  shaderStageParams[0].flags = 0;
  shaderStageParams[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
  shaderStageParams[0].module.m_internal =
       (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  shaderStageParams[0].pName = "main";
  shaderStageParams[0].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  shaderStageParams[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStageParams[1].pNext = (void *)0x0;
  shaderStageParams[1].flags = 0;
  shaderStageParams[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  shaderStageParams[1].module.m_internal =
       (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  shaderStageParams[1].pName = "main";
  shaderStageParams[1].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  vertexInputStateParams.pVertexBindingDescriptions = &vertexInputBindingDescription;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x10;
  vertexInputStateParams.pVertexAttributeDescriptions = &local_78;
  local_78.location = 0;
  local_78.binding = 0;
  local_78.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  local_78.offset = 0;
  local_68 = 1;
  local_60 = 0x6d;
  local_5c = (undefined4)__n;
  local_248 = &vertexInputStateParams;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateParams.pNext = (void *)0x0;
  vertexInputStateParams.flags = 0;
  vertexInputStateParams.vertexBindingDescriptionCount = 1;
  vertexInputStateParams.vertexAttributeDescriptionCount = 2;
  uStack_240 = &inputAssemblyStateParams;
  inputAssemblyStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  inputAssemblyStateParams.pNext = (void *)0x0;
  inputAssemblyStateParams.flags = 0;
  inputAssemblyStateParams.primitiveRestartEnable = 0;
  local_b8 = &local_90;
  local_90 = 0;
  scissor.extent.width = this->m_renderSize;
  local_88 = (float)scissor.extent.width;
  local_80 = 0x3f80000000000000;
  local_a8 = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  pVStack_230 = (VkPipelineShaderStageCreateInfo *)&vertexBufferOffset;
  vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x16);
  local_c8 = 0;
  local_c0 = 0x100000000;
  local_b0 = 1;
  multisampleStateParams.pNext = (void *)0x0;
  multisampleStateParams.pSampleMask = (VkSampleMask *)0x0;
  multisampleStateParams.alphaToCoverageEnable = 0;
  multisampleStateParams.alphaToOneEnable = 0;
  multisampleStateParams.sampleShadingEnable = 0;
  multisampleStateParams.minSampleShading = 0.0;
  multisampleStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  multisampleStateParams._4_4_ = 0;
  multisampleStateParams._16_8_ = (ulong)this->m_sampleCount << 0x20;
  _message = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_258 = 0x200000000;
  local_238 = (VkPipelineTessellationStateCreateInfo *)0x0;
  scissor.extent.height = scissor.extent.width;
  local_84 = local_88;
  inputAssemblyStateParams.topology = primitiveTopology;
  iVar10 = (*(this->super_TestInstance)._vptr_TestInstance[5])(this);
  local_228 = (VkPipelineRasterizationStateCreateInfo *)CONCAT44(extraout_var,iVar10);
  local_220 = &multisampleStateParams;
  local_218 = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  iVar10 = (*(this->super_TestInstance)._vptr_TestInstance[6])(this);
  pVVar12 = local_330;
  local_210 = (VkPipelineColorBlendStateCreateInfo *)CONCAT44(extraout_var_00,iVar10);
  local_208 = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_200.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  local_1f8.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_1f0 = 0;
  local_1e8.m_internal = 0;
  local_1e0 = 0;
  ::vk::createGraphicsPipeline
            (&local_2f8,vk,local_330,(VkPipelineCache)0x0,(VkGraphicsPipelineCreateInfo *)&message,
             (VkAllocationCallbacks *)0x0);
  obj.m_internal = local_2f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
  ;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  _message = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_258 = local_258 & 0xffffffff00000000;
  pVStack_250 = (VkPipelineShaderStageCreateInfo *)(__n * 2);
  local_248 = (VkPipelineVertexInputStateCreateInfo *)0x80;
  uStack_240 = (VkPipelineInputAssemblyStateCreateInfo *)CONCAT44(uStack_240._4_4_,1);
  local_238 = (VkPipelineTessellationStateCreateInfo *)&queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&vertexInputStateParams,vk,pVVar12,
                     (VkBufferCreateInfo *)&message,(VkAllocationCallbacks *)0x0);
  pVVar8 = vertexInputStateParams.pVertexBindingDescriptions;
  uVar5 = vertexInputStateParams._16_8_;
  pvVar16 = vertexInputStateParams.pNext;
  uVar4 = vertexInputStateParams._0_8_;
  shaderStageParams[0].flags = vertexInputStateParams.flags;
  shaderStageParams[0].stage = vertexInputStateParams.vertexBindingDescriptionCount;
  shaderStageParams[0].module.m_internal =
       (deUint64)vertexInputStateParams.pVertexBindingDescriptions;
  shaderStageParams[0].sType = vertexInputStateParams.sType;
  shaderStageParams[0]._4_4_ = vertexInputStateParams._4_4_;
  shaderStageParams[0].pNext = vertexInputStateParams.pNext;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateParams._4_4_ = 0;
  vertexInputStateParams.pNext = (void *)0x0;
  vertexInputStateParams.flags = 0;
  vertexInputStateParams.vertexBindingDescriptionCount = 0;
  vertexInputStateParams.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  if (local_3d8.m_internal == 0) {
    DStack_3d0.m_device = (VkDevice)uVar5;
    DStack_3d0.m_allocator = (VkAllocationCallbacks *)pVVar8;
    local_3d8.m_internal = uVar4;
    DStack_3d0.m_deviceIface = (DeviceInterface *)pvVar16;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_3d0,local_3d8);
    local_3d8.m_internal = shaderStageParams[0]._0_8_;
    DStack_3d0.m_deviceIface = (DeviceInterface *)shaderStageParams[0].pNext;
    DStack_3d0.m_device = (VkDevice)shaderStageParams[0]._16_8_;
    DStack_3d0.m_allocator = (VkAllocationCallbacks *)shaderStageParams[0].module.m_internal;
    if (vertexInputStateParams._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&vertexInputStateParams.pNext,
                 (VkBuffer)vertexInputStateParams._0_8_);
    }
  }
  ::vk::getBufferMemoryRequirements((VkMemoryRequirements *)shaderStageParams,vk,pVVar12,local_3d8);
  (*local_2c0->_vptr_Allocator[3])(&vertexInputStateParams,local_2c0,shaderStageParams,1);
  uVar4 = vertexInputStateParams._0_8_;
  local_3e8 = (long *)vertexInputStateParams._0_8_;
  VVar11 = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,pVVar12,local_3d8.m_internal,
                      *(undefined8 *)(vertexInputStateParams._0_8_ + 8),
                      *(undefined8 *)(vertexInputStateParams._0_8_ + 0x10));
  ::vk::checkResult(VVar11,
                    "vkd.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x30d);
  memcpy(*(void **)(uVar4 + 0x18),
         (local_338->
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)._M_impl
         .super__Vector_impl_data._M_start,__n);
  memcpy((void *)(*(long *)(uVar4 + 0x18) + __n),
         (local_2c8->
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)._M_impl
         .super__Vector_impl_data._M_start,__n);
  ::vk::flushMappedMemoryRange
            (vk,pVVar12,(VkDeviceMemory)*(deUint64 *)(uVar4 + 8),*(VkDeviceSize *)(uVar4 + 0x10),
             (VkDeviceSize)pVStack_250);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)shaderStageParams,vk,pVVar12,
             (VkCommandPool)
             (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
             m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar7 = shaderStageParams[0].module;
  uVar5 = shaderStageParams[0]._16_8_;
  pvVar16 = shaderStageParams[0].pNext;
  uVar4 = shaderStageParams[0]._0_8_;
  local_258._0_4_ = shaderStageParams[0].flags;
  local_258._4_4_ = shaderStageParams[0].stage;
  pVStack_250 = (VkPipelineShaderStageCreateInfo *)shaderStageParams[0].module.m_internal;
  _message = (VkCommandBuffer)shaderStageParams[0]._0_8_;
  shaderStageParams[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStageParams[0]._4_4_ = 0;
  shaderStageParams[0].pNext = (void *)0x0;
  shaderStageParams[0].flags = 0;
  shaderStageParams[0].stage = 0;
  uVar6 = shaderStageParams[0]._16_8_;
  shaderStageParams[0].module.m_internal = 0;
  if (local_408 == (VkCommandBuffer)0x0) {
    shaderStageParams[0].flags = (VkPipelineShaderStageCreateFlags)uVar5;
    shaderStageParams[0].stage = SUB84(uVar5,4);
    local_3f8._0_4_ = shaderStageParams[0].flags;
    local_3f8._4_4_ = shaderStageParams[0].stage;
    pVStack_3f0 = (VkPipelineShaderStageCreateInfo *)VVar7.m_internal;
    local_408 = (VkCommandBuffer)uVar4;
    plStack_400 = (long *)pvVar16;
    shaderStageParams[0]._16_8_ = uVar6;
  }
  else {
    vertexInputStateParams._0_8_ = local_408;
    (**(code **)(*plStack_400 + 0x240))(plStack_400,local_3f8,pVStack_3f0,1);
    local_408 = _message;
    plStack_400 = (long *)pvVar16;
    local_3f8._0_4_ = (VkPipelineCreateFlags)local_258;
    local_3f8._4_4_ = local_258._4_4_;
    pVStack_3f0 = pVStack_250;
    if (shaderStageParams[0]._0_8_ != 0) {
      _message = shaderStageParams[0].sType;
      uStack_264 = shaderStageParams[0]._4_4_;
      (**(code **)(*shaderStageParams[0].pNext + 0x240))
                (shaderStageParams[0].pNext,shaderStageParams[0]._16_8_,
                 shaderStageParams[0].module.m_internal,1);
    }
  }
  local_258._0_4_ = 0;
  local_258._4_4_ = 0;
  pVStack_250 = (VkPipelineShaderStageCreateInfo *)0x0;
  _message = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  uStack_264 = 0;
  VVar11 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_408);
  ::vk::checkResult(VVar11,"vkd.beginCommandBuffer(*commandBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x322);
  addImageTransitionBarrier
            ((BaseRenderingTestInstance *)(this->super_TestInstance).m_context,local_408,
             (VkImage)(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,1,0x10000,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
  if (this->m_multisampling != 0) {
    addImageTransitionBarrier
              ((BaseRenderingTestInstance *)(this->super_TestInstance).m_context,local_408,
               (VkImage)(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data
                        .object.m_internal,1,0x10000,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
               VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
  }
  shaderStageParams[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStageParams[0]._4_4_ = 0;
  shaderStageParams[0].pNext = (void *)0x3f80000000000000;
  _message = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  local_258 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
              m_internal;
  pVStack_250 = (VkPipelineShaderStageCreateInfo *)
                (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
                m_internal;
  local_248 = (VkPipelineVertexInputStateCreateInfo *)0x0;
  uStack_240 = (VkPipelineInputAssemblyStateCreateInfo *)
               CONCAT44(this->m_renderSize,this->m_renderSize);
  local_238 = (VkPipelineTessellationStateCreateInfo *)CONCAT44(local_238._4_4_,1);
  pVStack_230 = shaderStageParams;
  (*vk->_vptr_DeviceInterface[0x74])(vk,local_408,&message,0);
  vertexBufferOffset = 0;
  (*vk->_vptr_DeviceInterface[0x4c])(vk,local_408,0,obj.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_408,0,
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,0,1,&this->m_descriptorSet,0,0);
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_408,0,1,&local_3d8,&vertexBufferOffset);
  (*vk->_vptr_DeviceInterface[0x59])
            (vk,local_408,
             (ulong)((long)(local_338->
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_338->
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 4,1,0,0);
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_408);
  pSVar9 = local_2d0;
  _message = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  local_258._0_4_ = 0x1000;
  local_258._4_4_ = 0x2000;
  pVStack_250 = (VkPipelineShaderStageCreateInfo *)0xffffffffffffffff;
  local_248 = (VkPipelineVertexInputStateCreateInfo *)
              (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
              m_internal;
  uStack_240 = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  local_238 = (VkPipelineTessellationStateCreateInfo *)this->m_resultBufferSize;
  shaderStageParams[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStageParams[0]._4_4_ = 0;
  shaderStageParams[1].sType = this->m_renderSize;
  shaderStageParams[0].pNext =
       (void *)CONCAT44(shaderStageParams[1].sType,shaderStageParams[1].sType);
  shaderStageParams[0].flags = 1;
  shaderStageParams[0].stage = 0;
  shaderStageParams[0].module.m_internal = 0x100000000;
  shaderStageParams[0].pName = (char *)0x0;
  shaderStageParams[0].pSpecializationInfo =
       (VkSpecializationInfo *)((ulong)shaderStageParams[1].sType << 0x20);
  shaderStageParams[1]._4_4_ = 1;
  pMVar14 = &this->m_resolvedImage;
  if (this->m_multisampling == 0) {
    pMVar14 = &this->m_image;
  }
  addImageTransitionBarrier
            ((BaseRenderingTestInstance *)(this->super_TestInstance).m_context,local_408,
             (VkImage)(pMVar14->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                      m_internal,0x400,0x1000,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);
  pMVar14 = &this->m_resolvedImage;
  if (this->m_multisampling == 0) {
    pMVar14 = &this->m_image;
  }
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_408,
             (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal,6,
             (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,shaderStageParams);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_408,0x1000,0x4000,0,0,0,1,&message,0,0);
  VVar11 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_408);
  ::vk::checkResult(VVar11,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x37f);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  pVVar12 = local_330;
  _message = extraout_XMM0_Da;
  memcpy(((this->m_uniformBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,&message,this->m_uniformBufferSize);
  pAVar2 = (this->m_uniformBufferMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (vk,pVVar12,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,
             this->m_uniformBufferSize);
  local_248 = (VkPipelineVertexInputStateCreateInfo *)0x0;
  pVStack_230 = (VkPipelineShaderStageCreateInfo *)0x0;
  local_258._0_4_ = 0;
  local_258._4_4_ = 0;
  pVStack_250 = (VkPipelineShaderStageCreateInfo *)0x0;
  local_228 = (VkPipelineRasterizationStateCreateInfo *)0x0;
  _message = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  uStack_264 = 0;
  uStack_240 = (VkPipelineInputAssemblyStateCreateInfo *)&DAT_00000001;
  pMVar1 = &this->m_fence;
  local_238 = (VkPipelineTessellationStateCreateInfo *)&local_408;
  VVar11 = (*vk->_vptr_DeviceInterface[0x14])(vk,pVVar12,1,pMVar1);
  ::vk::checkResult(VVar11,"vkd.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x397);
  VVar11 = (*vk->_vptr_DeviceInterface[2])
                     (vk,local_2d8,1,&message,
                      (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.
                      m_internal);
  ::vk::checkResult(VVar11,"vkd.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x398);
  VVar11 = (*vk->_vptr_DeviceInterface[0x16])(vk,pVVar12,1,pMVar1,1,0xffffffffffffffff);
  ::vk::checkResult(VVar11,"vkd.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x399);
  pAVar2 = (this->m_resultBufferMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,pVVar12,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,
             this->m_resultBufferSize);
  plVar3 = local_3e8;
  shaderStageParams[0].sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  shaderStageParams[0]._4_4_ = 3;
  pvVar16 = (void *)(pSVar9->m_pixels).m_cap;
  if (pvVar16 != (void *)0x0) {
    pvVar16 = (pSVar9->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&message,(TextureFormat *)shaderStageParams,pSVar9->m_width,
             pSVar9->m_height,1,pvVar16);
  vertexInputStateParams._4_4_ = this->m_renderSize;
  vertexInputStateParams.sType = this->m_renderSize;
  vertexInputStateParams.pNext = (void *)CONCAT44(vertexInputStateParams.pNext._4_4_,1);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)shaderStageParams,&this->m_textureFormat,
             (IVec3 *)&vertexInputStateParams,
             ((this->m_resultBufferMemory).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  tcu::copy((EVP_PKEY_CTX *)&message,(EVP_PKEY_CTX *)shaderStageParams);
  (**(code **)(*plVar3 + 8))(plVar3);
  if (local_3d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_3d0,local_3d8);
  }
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_350,(VkPipeline)obj.m_internal);
  }
  if (local_408 != (VkCommandBuffer)0x0) {
    _message = local_408;
    (**(code **)(*plStack_400 + 0x240))(plStack_400,local_3f8,pVStack_3f0,1);
  }
  return;
}

Assistant:

void BaseRenderingTestInstance::drawPrimitives (tcu::Surface& result, const std::vector<tcu::Vec4>& positionData, const std::vector<tcu::Vec4>& colorData, VkPrimitiveTopology primitiveTopology)
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const VkQueue								queue					= m_context.getUniversalQueue();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();
	const size_t								attributeBatchSize		= positionData.size() * sizeof(tcu::Vec4);

	Move<VkCommandBuffer>						commandBuffer;
	Move<VkPipeline>							graphicsPipeline;
	Move<VkBuffer>								vertexBuffer;
	de::MovePtr<Allocation>						vertexBufferMemory;
	const VkPhysicalDeviceProperties			properties				= m_context.getDeviceProperties();

	if (attributeBatchSize > properties.limits.maxVertexInputAttributeOffset)
	{
		std::stringstream message;
		message << "Larger vertex input attribute offset is needed (" << attributeBatchSize << ") than the available maximum (" << properties.limits.maxVertexInputAttributeOffset << ").";
		TCU_THROW(NotSupportedError, message.str().c_str());
	}

	// Create Graphics Pipeline
	{
		const VkPipelineShaderStageCreateInfo	shaderStageParams[2]	=
		{
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,		// VkStructureType					sType;
				DE_NULL,													// const void*						pNext;
				0,															// VkPipelineShaderStageCreateFlags flags;
				VK_SHADER_STAGE_VERTEX_BIT,									// VkShaderStage					stage;
				*m_vertexShaderModule,										// VkShader							shader;
				"main",														// const char*						pName;
				DE_NULL														// const VkSpecializationInfo*		pSpecializationInfo;
			},
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,		// VkStructureType					sType;
				DE_NULL,													// const void*						pNext;
				0,															// VkPipelineShaderStageCreateFlags flags;
				VK_SHADER_STAGE_FRAGMENT_BIT,								// VkShaderStage					stage;
				*m_fragmentShaderModule,									// VkShader							shader;
				"main",														// const char*						pName;
				DE_NULL														// const VkSpecializationInfo*		pSpecializationInfo;
			}
		};

		const VkVertexInputBindingDescription	vertexInputBindingDescription =
		{
			0u,								// deUint32					binding;
			sizeof(tcu::Vec4),				// deUint32					strideInBytes;
			VK_VERTEX_INPUT_RATE_VERTEX		// VkVertexInputStepRate	stepRate;
		};

		const VkVertexInputAttributeDescription	vertexInputAttributeDescriptions[2] =
		{
			{
				0u,									// deUint32	location;
				0u,									// deUint32	binding;
				VK_FORMAT_R32G32B32A32_SFLOAT,		// VkFormat	format;
				0u									// deUint32	offsetInBytes;
			},
			{
				1u,									// deUint32	location;
				0u,									// deUint32	binding;
				VK_FORMAT_R32G32B32A32_SFLOAT,		// VkFormat	format;
				(deUint32)attributeBatchSize		// deUint32	offsetInBytes;
			}
		};

		const VkPipelineVertexInputStateCreateInfo	vertexInputStateParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType							sType;
			DE_NULL,														// const void*								pNext;
			0,																// VkPipelineVertexInputStateCreateFlags	flags;
			1u,																// deUint32									bindingCount;
			&vertexInputBindingDescription,									// const VkVertexInputBindingDescription*	pVertexBindingDescriptions;
			2u,																// deUint32									attributeCount;
			vertexInputAttributeDescriptions								// const VkVertexInputAttributeDescription*	pVertexAttributeDescriptions;
		};

		const VkPipelineInputAssemblyStateCreateInfo	inputAssemblyStateParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType							sType;
			DE_NULL,														// const void*								pNext;
			0,																// VkPipelineInputAssemblyStateCreateFlags	flags;
			primitiveTopology,												// VkPrimitiveTopology						topology;
			false															// VkBool32									primitiveRestartEnable;
		};

		const VkViewport						viewport =
		{
			0.0f,						// float	originX;
			0.0f,						// float	originY;
			(float)m_renderSize,		// float	width;
			(float)m_renderSize,		// float	height;
			0.0f,						// float	minDepth;
			1.0f						// float	maxDepth;
		};

		const VkRect2D							scissor =
		{
			{ 0, 0 },														// VkOffset2D  offset;
			{ m_renderSize, m_renderSize }									// VkExtent2D  extent;
		};

		const VkPipelineViewportStateCreateInfo	viewportStateParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,			// VkStructureType						sType;
			DE_NULL,														// const void*							pNext;
			0,																// VkPipelineViewportStateCreateFlags	flags;
			1u,																// deUint32								viewportCount;
			&viewport,														// const VkViewport*					pViewports;
			1u,																// deUint32								scissorCount;
			&scissor														// const VkRect2D*						pScissors;
		};

		const VkPipelineMultisampleStateCreateInfo multisampleStateParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,		// VkStructureType							sType;
			DE_NULL,														// const void*								pNext;
			0u,																// VkPipelineMultisampleStateCreateFlags	flags;
			m_sampleCount,													// VkSampleCountFlagBits					rasterizationSamples;
			VK_FALSE,														// VkBool32									sampleShadingEnable;
			0.0f,															// float									minSampleShading;
			DE_NULL,														// const VkSampleMask*						pSampleMask;
			VK_FALSE,														// VkBool32									alphaToCoverageEnable;
			VK_FALSE														// VkBool32									alphaToOneEnable;
		};

		const VkGraphicsPipelineCreateInfo graphicsPipelineParams =
		{
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,	// VkStructureType									sType;
			DE_NULL,											// const void*										pNext;
			0u,													// VkPipelineCreateFlags							flags;
			2u,													// deUint32											stageCount;
			shaderStageParams,									// const VkPipelineShaderStageCreateInfo*			pStages;
			&vertexInputStateParams,							// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
			&inputAssemblyStateParams,							// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
			DE_NULL,											// const VkPipelineTessellationStateCreateInfo*		pTessellationState;
			&viewportStateParams,								// const VkPipelineViewportStateCreateInfo*			pViewportState;
			getRasterizationStateCreateInfo(),					// const VkPipelineRasterStateCreateInfo*			pRasterizationState;
			&multisampleStateParams,							// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
			DE_NULL,											// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
			getColorBlendStateCreateInfo(),						// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
			DE_NULL,											// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
			*m_pipelineLayout,									// VkPipelineLayout									layout;
			*m_renderPass,										// VkRenderPass										renderPass;
			0u,													// deUint32											subpass;
			0u,													// VkPipeline										basePipelineHandle;
			0u													// deInt32											basePipelineIndex;
		};

		graphicsPipeline		= createGraphicsPipeline(vkd, vkDevice, DE_NULL, &graphicsPipelineParams);
	}

	// Create Vertex Buffer
	{
		const VkBufferCreateInfo			vertexBufferParams		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			attributeBatchSize * 2,						// VkDeviceSize			size;
			VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		vertexBuffer		= createBuffer(vkd, vkDevice, &vertexBufferParams);
		vertexBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *vertexBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset()));

		// Load vertices into vertex buffer
		deMemcpy(vertexBufferMemory->getHostPtr(), positionData.data(), attributeBatchSize);
		deMemcpy(reinterpret_cast<deUint8*>(vertexBufferMemory->getHostPtr()) +  attributeBatchSize, colorData.data(), attributeBatchSize);
		flushMappedMemoryRange(vkd, vkDevice, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset(), vertexBufferParams.size);
	}

	// Create Command Buffer
	commandBuffer = allocateCommandBuffer(vkd, vkDevice, *m_commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Begin Command Buffer
	{
		const VkCommandBufferBeginInfo		cmdBufferBeginInfo		=
		{
			VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType							sType;
			DE_NULL,										// const void*								pNext;
			0u,												// VkCmdBufferOptimizeFlags					flags;
			DE_NULL											// const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
		};

		VK_CHECK(vkd.beginCommandBuffer(*commandBuffer, &cmdBufferBeginInfo));
	}

	addImageTransitionBarrier(*commandBuffer, *m_image,
							  VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT,				// VkPipelineStageFlags		srcStageMask
							  VK_PIPELINE_STAGE_ALL_COMMANDS_BIT,				// VkPipelineStageFlags		dstStageMask
							  0,												// VkAccessFlags			srcAccessMask
							  VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags			dstAccessMask
							  VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
							  VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);		// VkImageLayout			newLayout;

	if (m_multisampling) {
		addImageTransitionBarrier(*commandBuffer, *m_resolvedImage,
								  VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT,				// VkPipelineStageFlags		srcStageMask
								  VK_PIPELINE_STAGE_ALL_COMMANDS_BIT,				// VkPipelineStageFlags		dstStageMask
								  0,												// VkAccessFlags			srcAccessMask
								  VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags			dstAccessMask
								  VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
								  VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);		// VkImageLayout			newLayout;
	}

	// Begin Render Pass
	{
		const VkClearValue					clearValue				= makeClearValueColorF32(0.0, 0.0, 0.0, 1.0);

		const VkRenderPassBeginInfo			renderPassBeginInfo		=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,				// VkStructureType		sType;
			DE_NULL,												// const void*			pNext;
			*m_renderPass,											// VkRenderPass			renderPass;
			*m_frameBuffer,											// VkFramebuffer		framebuffer;
			{
				{ 0, 0 },
				{ m_renderSize, m_renderSize }
			},														// VkRect2D				renderArea;
			1u,														// deUint32				clearValueCount;
			&clearValue												// const VkClearValue*	pClearValues;
		};

		vkd.cmdBeginRenderPass(*commandBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
	}

	const VkDeviceSize						vertexBufferOffset		= 0;

	vkd.cmdBindPipeline(*commandBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *graphicsPipeline);
	vkd.cmdBindDescriptorSets(*commandBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipelineLayout, 0u, 1, &m_descriptorSet.get(), 0u, DE_NULL);
	vkd.cmdBindVertexBuffers(*commandBuffer, 0, 1, &vertexBuffer.get(), &vertexBufferOffset);
	vkd.cmdDraw(*commandBuffer, (deUint32)positionData.size(), 1, 0, 0);
	vkd.cmdEndRenderPass(*commandBuffer);

	// Copy Image
	{

		const VkBufferMemoryBarrier			bufferBarrier			=
		{
			VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			VK_ACCESS_TRANSFER_WRITE_BIT,				// VkMemoryOutputFlags	outputMask;
			VK_ACCESS_HOST_READ_BIT,					// VkMemoryInputFlags	inputMask;
			VK_QUEUE_FAMILY_IGNORED,					// deUint32				srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,					// deUint32				destQueueFamilyIndex;
			*m_resultBuffer,							// VkBuffer				buffer;
			0u,											// VkDeviceSize			offset;
			m_resultBufferSize							// VkDeviceSize			size;
		};

		const VkBufferImageCopy				copyRegion				=
		{
			0u,											// VkDeviceSize				bufferOffset;
			m_renderSize,								// deUint32					bufferRowLength;
			m_renderSize,								// deUint32					bufferImageHeight;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u },	// VkImageSubresourceCopy	imageSubresource;
			{ 0, 0, 0 },								// VkOffset3D				imageOffset;
			{ m_renderSize, m_renderSize, 1u }			// VkExtent3D				imageExtent;
		};

		addImageTransitionBarrier(*commandBuffer,
								  m_multisampling ? *m_resolvedImage : *m_image,
								  VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT,		// VkPipelineStageFlags		srcStageMask
								  VK_PIPELINE_STAGE_TRANSFER_BIT,						// VkPipelineStageFlags		dstStageMask
								  VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,					// VkAccessFlags			srcAccessMask
								  VK_ACCESS_TRANSFER_READ_BIT,							// VkAccessFlags			dstAccessMask
								  VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,				// VkImageLayout			oldLayout;
								  VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);				// VkImageLayout			newLayout;)

		if (m_multisampling)
			vkd.cmdCopyImageToBuffer(*commandBuffer, *m_resolvedImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *m_resultBuffer, 1, &copyRegion);
		else
			vkd.cmdCopyImageToBuffer(*commandBuffer, *m_image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *m_resultBuffer, 1, &copyRegion);

		vkd.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &bufferBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vkd.endCommandBuffer(*commandBuffer));

	// Set Point Size
	{
		float	pointSize	= getPointSize();
		deMemcpy(m_uniformBufferMemory->getHostPtr(), &pointSize, (size_t)m_uniformBufferSize);
		flushMappedMemoryRange(vkd, vkDevice, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset(), m_uniformBufferSize);
	}

	// Submit
	{
		const VkSubmitInfo					submitInfo				=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			0u,										// deUint32						waitSemaphoreCount;
			DE_NULL,								// const VkSemaphore*			pWaitSemaphores;
			DE_NULL,								// const VkPipelineStageFlags*	pWaitDstStageMask;
			1u,										// deUint32						commandBufferCount;
			&commandBuffer.get(),					// const VkCommandBuffer*		pCommandBuffers;
			0u,										// deUint32						signalSemaphoreCount;
			DE_NULL,								// const VkSemaphore*			pSignalSemaphores;
		};

		VK_CHECK(vkd.resetFences(vkDevice, 1, &m_fence.get()));
		VK_CHECK(vkd.queueSubmit(queue, 1, &submitInfo, *m_fence));
		VK_CHECK(vkd.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));
	}

	invalidateMappedMemoryRange(vkd, vkDevice, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset(), m_resultBufferSize);
	tcu::copy(result.getAccess(), tcu::ConstPixelBufferAccess(m_textureFormat, tcu::IVec3(m_renderSize, m_renderSize, 1), m_resultBufferMemory->getHostPtr()));
}